

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ConstraintPrototypeSyntax::getChild(ConstraintPrototypeSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  undefined8 in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff78;
  TokenOrSyntax *in_stack_ffffffffffffff80;
  nullptr_t in_stack_ffffffffffffff88;
  Info *in_stack_ffffffffffffff90;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 1:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 2:
    token.info = in_stack_ffffffffffffff90;
    token._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token);
    break;
  case 3:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x98),in_stack_ffffffffffffff78);
    break;
  case 4:
    not_null<slang::syntax::NameSyntax_*>::get
              ((not_null<slang::syntax::NameSyntax_*> *)(in_RSI + 0xd0));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 5:
    token_00.info = in_stack_ffffffffffffff90;
    token_00._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token_00);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax ConstraintPrototypeSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &qualifiers;
        case 2: return keyword;
        case 3: return &specifiers;
        case 4: return name.get();
        case 5: return semi;
        default: return nullptr;
    }
}